

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_in_array(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  int iVar2;
  int in_ECX;
  jx9_hashmap_node **ppNode;
  jx9_value *pjVar3;
  anon_union_8_3_18420de5_for_x aVar4;
  
  if (nArg < 2) {
    pjVar3 = pCtx->pRet;
    jx9MemObjRelease(pjVar3);
    (pjVar3->x).rVal = 0.0;
    goto LAB_00138422;
  }
  pjVar3 = *apArg;
  ppNode = (jx9_hashmap_node **)0x0;
  if (nArg != 2) {
    pjVar1 = apArg[2];
    jx9MemObjToBool(pjVar1);
    ppNode = (jx9_hashmap_node **)(ulong)*(uint *)&pjVar1->x;
  }
  pjVar1 = apArg[1];
  if ((pjVar1->iFlags & 0x40) == 0) {
    if (pjVar3 != (jx9_value *)0x0) {
      iVar2 = jx9MemObjCmp(pjVar3,pjVar1,(int)ppNode,in_ECX);
      goto LAB_0013840a;
    }
    aVar4.rVal = 0.0;
  }
  else {
    iVar2 = HashmapFindValue((jx9_hashmap *)(pjVar1->x).pOther,pjVar3,ppNode,in_ECX);
LAB_0013840a:
    aVar4.iVal._1_7_ = 0;
    aVar4.iVal._0_1_ = iVar2 == 0;
  }
  pjVar3 = pCtx->pRet;
  jx9MemObjRelease(pjVar3);
  pjVar3->x = aVar4;
LAB_00138422:
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9_hashmap_in_array(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pNeedle;
	int bStrict;
	int rc;
	if( nArg < 2 ){
		/* Missing argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pNeedle = apArg[0];
	bStrict = 0;
	if( nArg > 2 ){
		bStrict = jx9_value_to_bool(apArg[2]);
	}
	if( !jx9_value_is_json_array(apArg[1]) ){
		/* haystack must be an array, perform a standard comparison */ 
		rc = jx9_value_compare(pNeedle, apArg[1], bStrict);
		/* Set the comparison result */
		jx9_result_bool(pCtx, rc == 0);
		return JX9_OK;
	}
	/* Perform the lookup */
	rc = HashmapFindValue((jx9_hashmap *)apArg[1]->x.pOther, pNeedle, 0, bStrict);
	/* Lookup result */
	jx9_result_bool(pCtx, rc == SXRET_OK);
	return JX9_OK;
}